

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGLSLnoperspectiveTests.cpp
# Opt level: O1

IterateResult __thiscall gl3cts::FunctionalTest::iterate(FunctionalTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  int iVar5;
  undefined4 extraout_var;
  TestError *this_00;
  char *description;
  ulong uVar7;
  size_t i;
  long lVar8;
  bool bVar9;
  GLuint vao_id;
  GLuint vab_id;
  GLuint tex_ids [4];
  GLuint fbo_ids [4];
  vector<unsigned_int,_std::allocator<unsigned_int>_> noperspective_data;
  GLuint po_ids [4];
  vector<unsigned_int,_std::allocator<unsigned_int>_> fbo_data;
  long lVar6;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  if (iterate()::shaders == '\0') {
    iterate();
  }
  po_ids[0] = 0;
  po_ids[1] = 0;
  po_ids[2] = 0;
  po_ids[3] = 0;
  tex_ids[0] = 0;
  tex_ids[1] = 0;
  tex_ids[2] = 0;
  tex_ids[3] = 0;
  fbo_ids[0] = 0;
  fbo_ids[1] = 0;
  fbo_ids[2] = 0;
  fbo_ids[3] = 0;
  vab_id = 0;
  vao_id = 0;
  (**(code **)(lVar6 + 0x6c8))(1);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"GenBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x18a);
  (**(code **)(lVar6 + 0x40))(0x8892,vab_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x18d);
  (**(code **)(lVar6 + 0x150))(0x8892,0x50,0,0x88e4);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"BufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,400);
  (**(code **)(lVar6 + 0x168))(0x8892,0,0x40,iterate::positions_data);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"BufferSubData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x193);
  (**(code **)(lVar6 + 0x168))(0x8892,0x40,0x10,iterate::colors_data);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"BufferSubData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x197);
  (**(code **)(lVar6 + 0x6d0))(4,fbo_ids);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"GenFramebuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x19b);
  (**(code **)(lVar6 + 0x6f8))(4,tex_ids);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x19f);
  (**(code **)(lVar6 + 0x708))(1,&vao_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"GenVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x1a3);
  (**(code **)(lVar6 + 0xd8))(vao_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"BindVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x1a6);
  lVar8 = 0;
  do {
    GVar4 = prepare_program((this->super_TestCase).m_context,
                            *(GLchar **)((long)iterate::shaders[0] + lVar8 * 4 + 8),
                            *(GLchar **)((long)iterate::shaders[0] + lVar8 * 4));
    *(GLuint *)((long)po_ids + lVar8) = GVar4;
    (**(code **)(lVar6 + 0xb8))(0xde1,*(undefined4 *)((long)tex_ids + lVar8));
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1af);
    (**(code **)(lVar6 + 0x1310))(0xde1,0,0x8058,0x40,0x40,0,0x1908,0x1401,0);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"TexImage2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1b3);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,0x2600);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x813d,0);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"TexParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1b8);
    (**(code **)(lVar6 + 0x78))(0x8d40,*(undefined4 *)((long)fbo_ids + lVar8));
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"BindFramebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1bc);
    (**(code **)(lVar6 + 0x6a0))(0x8d40,0x8ce0,0xde1,*(undefined4 *)((long)tex_ids + lVar8),0);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"FramebufferTexture2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1bf);
    (**(code **)(lVar6 + 0x1a00))(0,0,0x40,0x40);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"Viewport",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1c3);
    iVar2 = (**(code **)(lVar6 + 0x780))(GVar4,"in_position");
    iVar5 = (**(code **)(lVar6 + 0x780))(GVar4,"in_color");
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"GetAttribLocation",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1c8);
    if ((iVar2 == -1) || (iVar5 == -1)) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Attributes are not available",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                 ,0x1cb);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar6 + 0x19f0))(iVar2,4,0x1406,0,0,0);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"VertexAttribPointer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1d0);
    (**(code **)(lVar6 + 0x19f0))(iVar5,4,0x1401,1,0);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"VertexAttribPointer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1d4);
    (**(code **)(lVar6 + 0x610))(iVar2);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"EnableVertexAttribArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1d7);
    (**(code **)(lVar6 + 0x610))(iVar5);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"EnableVertexAttribArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1da);
    (**(code **)(lVar6 + 0x1c0))(0,0,0,0x3f800000);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"ClearColor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1de);
    (**(code **)(lVar6 + 0x188))(0x4000);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"Clear",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1e1);
    (**(code **)(lVar6 + 0x1680))(GVar4);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1e5);
    (**(code **)(lVar6 + 0x538))(5,0,4);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"DrawArrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1e9);
    (**(code **)(lVar6 + 0x518))(iVar2);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"DisableVertexAttribArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1ed);
    (**(code **)(lVar6 + 0x518))(iVar5);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"DisableVertexAttribArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x1f0);
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x10);
  fbo_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fbo_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fbo_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  noperspective_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  noperspective_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  noperspective_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&fbo_data,0x1000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&noperspective_data,0x1000);
  (**(code **)(lVar6 + 0xb8))(0xde1,tex_ids._0_8_ & 0xffffffff);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x1fe);
  (**(code **)(lVar6 + 0xaa0))
            (0xde1,0,0x1908,0x1401,
             noperspective_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"GetTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x201);
  lVar8 = 0;
  do {
    if (lVar8 != 0) {
      (**(code **)(lVar6 + 0xb8))(0xde1,tex_ids[lVar8]);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"BindTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                      ,0x20d);
      (**(code **)(lVar6 + 0xaa0))
                (0xde1,0,0x1908,0x1401,
                 fbo_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"GetTexImage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                      ,0x210);
      uVar7 = 0;
      do {
        bVar1 = false;
        if (noperspective_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar7] !=
            fbo_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7]) break;
        bVar9 = uVar7 < 0xfff;
        uVar7 = uVar7 + 1;
        bVar1 = true;
      } while (bVar9);
      bVar9 = false;
      if (bVar1) break;
    }
    lVar8 = lVar8 + 1;
    bVar9 = true;
  } while (lVar8 != 4);
  if (noperspective_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(noperspective_data.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)noperspective_data.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)noperspective_data.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (fbo_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fbo_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)fbo_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fbo_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (**(code **)(lVar6 + 0x40))(0x8892,0);
  (**(code **)(lVar6 + 0x78))(0x8d40,0);
  (**(code **)(lVar6 + 0xb8))(0xde1,0);
  (**(code **)(lVar6 + 0xd8))(0);
  (**(code **)(lVar6 + 0x1680))(0);
  (**(code **)(lVar6 + 0x438))(1,&vab_id);
  vab_id = 0;
  (**(code **)(lVar6 + 0x490))(1,&vao_id);
  vao_id = 0;
  (**(code **)(lVar6 + 0x440))(4,fbo_ids);
  (**(code **)(lVar6 + 0x480))(4);
  fbo_ids[0] = 0;
  fbo_ids[1] = 0;
  fbo_ids[2] = 0;
  fbo_ids[3] = 0;
  tex_ids[0] = 0;
  tex_ids[1] = 0;
  tex_ids[2] = 0;
  tex_ids[3] = 0;
  lVar8 = 0;
  do {
    if (po_ids[lVar8] != 0) {
      (**(code **)(lVar6 + 0x448))();
      po_ids[lVar8] = 0;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  if (!bVar9) {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar9,description
            );
  (**(code **)(lVar6 + 0x40))(0x8892,0);
  (**(code **)(lVar6 + 0x78))(0x8d40,0);
  (**(code **)(lVar6 + 0xb8))(0xde1,0);
  (**(code **)(lVar6 + 0xd8))(0);
  (**(code **)(lVar6 + 0x1680))(0);
  if (vao_id != 0) {
    (**(code **)(lVar6 + 0x490))(1,&vao_id);
  }
  if (vab_id != 0) {
    (**(code **)(lVar6 + 0x438))(1,&vab_id);
  }
  if (fbo_ids[0] != 0) {
    (**(code **)(lVar6 + 0x440))(1,fbo_ids);
  }
  lVar8 = 0;
  do {
    if (po_ids[lVar8] != 0) {
      (**(code **)(lVar6 + 0x448))();
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  if (tex_ids[0] != 0) {
    (**(code **)(lVar6 + 0x480))(1,tex_ids);
  }
  (**(code **)(lVar6 + 0x800))();
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest::iterate()
{
	static const char* vs_default = "#version 130\n"
									"\n"
									"in vec4 in_position;\n"
									"in vec4 in_color;\n"
									"\n"
									"out vec4 vs_fs_color;\n"
									"\n"
									"void main()\n"
									"{\n"
									"    gl_Position = in_position;\n"
									"    vs_fs_color = in_color;\n"
									"}\n"
									"\n";

	static const char* vs_flat = "#version 130\n"
								 "\n"
								 "in vec4 in_position;\n"
								 "in vec4 in_color;\n"
								 "\n"
								 "flat out vec4 vs_fs_color;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    gl_Position = in_position;\n"
								 "    vs_fs_color = in_color;\n"
								 "}\n"
								 "\n";

	static const char* vs_noperspective = "#version 130\n"
										  "\n"
										  "in vec4 in_position;\n"
										  "in vec4 in_color;\n"
										  "\n"
										  "noperspective out vec4 vs_fs_color;\n"
										  "\n"
										  "void main()\n"
										  "{\n"
										  "    gl_Position = in_position;\n"
										  "    vs_fs_color = in_color;\n"
										  "}\n"
										  "\n";

	static const char* vs_smooth = "#version 130\n"
								   "\n"
								   "in vec4 in_position;\n"
								   "in vec4 in_color;\n"
								   "\n"
								   "smooth out vec4 vs_fs_color;\n"
								   "\n"
								   "void main()\n"
								   "{\n"
								   "    gl_Position = in_position;\n"
								   "    vs_fs_color = in_color;\n"
								   "}\n"
								   "\n";

	static const char* fs_default = "#version 130\n"
									"\n"
									"in vec4 vs_fs_color;\n"
									"\n"
									"out vec4 out_color;\n"
									"\n"
									"void main()\n"
									"{\n"
									"    out_color = vs_fs_color;\n"
									"}\n"
									"\n";

	static const char* fs_flat = "#version 130\n"
								 "\n"
								 "flat in vec4 vs_fs_color;\n"
								 "\n"
								 "out vec4 out_color;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    out_color = vs_fs_color;\n"
								 "}\n"
								 "\n";

	static const char* fs_noperspective = "#version 130\n"
										  "\n"
										  "noperspective in vec4 vs_fs_color;\n"
										  "\n"
										  "out vec4 out_color;\n"
										  "\n"
										  "void main()\n"
										  "{\n"
										  "    out_color = vs_fs_color;\n"
										  "}\n"
										  "\n";

	static const char* fs_smooth = "#version 130\n"
								   "\n"
								   "smooth in vec4 vs_fs_color;\n"
								   "\n"
								   "out vec4 out_color;\n"
								   "\n"
								   "void main()\n"
								   "{\n"
								   "    out_color = vs_fs_color;\n"
								   "}\n"
								   "\n";

	static const glw::GLfloat positions_data[] = { -1.0f, 1.0f,  -1.0f, 1.0f, 3.0f, 3.0f,  3.0f, 3.0f,
												   -1.0f, -1.0f, -1.0f, 1.0f, 3.0f, -3.0f, 3.0f, 3.0f };
	static const glw::GLubyte colors_data[] = { 0xff, 0x00, 0x00, 0xff, 0x00, 0xff, 0x00, 0xff,
												0x00, 0x00, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff };

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	static const char* shaders[][2] = { { vs_noperspective, fs_noperspective },
										{ vs_default, fs_default },
										{ vs_flat, fs_flat },
										{ vs_smooth, fs_smooth } };
	static const size_t		  n_shaders			= sizeof(shaders) / sizeof(shaders[0]);
	static const size_t		  noperspective_idx = 0;
	static const glw::GLsizei w					= 64;
	static const glw::GLsizei h					= 64;
	static const glw::GLsizei image_length		= w * h;

	bool test_result = true;

	glw::GLuint po_ids[n_shaders]  = { 0 };
	glw::GLuint tex_ids[n_shaders] = { 0 };
	glw::GLuint fbo_ids[n_shaders] = { 0 };
	glw::GLuint vab_id			   = 0;
	glw::GLuint vao_id			   = 0;

	try
	{
		/* Buffer */
		gl.genBuffers(1, &vab_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GenBuffers");

		gl.bindBuffer(GL_ARRAY_BUFFER, vab_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

		gl.bufferData(GL_ARRAY_BUFFER, sizeof(colors_data) + sizeof(positions_data), 0 /* data */, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");

		gl.bufferSubData(GL_ARRAY_BUFFER, 0 /* offset */, sizeof(positions_data) /* size */, positions_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BufferSubData");

		gl.bufferSubData(GL_ARRAY_BUFFER, sizeof(positions_data) /* offset */, sizeof(colors_data) /* size */,
						 colors_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BufferSubData");

		/* FBOs */
		gl.genFramebuffers(n_shaders, fbo_ids);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GenFramebuffers");

		/* Textures */
		gl.genTextures(n_shaders, tex_ids);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

		/* VAO */
		gl.genVertexArrays(1, &vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GenVertexArrays");

		gl.bindVertexArray(vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexArrays");

		for (size_t i = 0; i < n_shaders; ++i)
		{
			/* Program */
			po_ids[i] = prepare_program(m_context, shaders[i][1], shaders[i][0]);

			/* Texture */
			gl.bindTexture(GL_TEXTURE_2D, tex_ids[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

			gl.texImage2D(GL_TEXTURE_2D, 0 /* level */, GL_RGBA8, w, h, 0 /* border */, GL_RGBA, GL_UNSIGNED_BYTE,
						  0 /* data */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TexImage2D");

			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");

			/* FBO */
			gl.bindFramebuffer(GL_FRAMEBUFFER, fbo_ids[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");

			gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex_ids[i], 0 /* level */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "FramebufferTexture2D");

			/* Viewport */
			gl.viewport(0, 0, w, h);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Viewport");

			/* VAO */
			glw::GLint in_position_loc = gl.getAttribLocation(po_ids[i], "in_position");
			glw::GLint in_color_loc	= gl.getAttribLocation(po_ids[i], "in_color");
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetAttribLocation");
			if ((-1 == in_position_loc) || (-1 == in_color_loc))
			{
				TCU_FAIL("Attributes are not available");
			}

			gl.vertexAttribPointer(in_position_loc, 4 /* size */, GL_FLOAT, GL_FALSE /* normalizeed */, 0 /* stride */,
								   0 /* offset */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribPointer");

			gl.vertexAttribPointer(in_color_loc, 4 /* size */, GL_UNSIGNED_BYTE, GL_TRUE /* normalizeed */,
								   0 /* stride */, (glw::GLvoid*)sizeof(positions_data) /* offset */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribPointer");

			gl.enableVertexAttribArray(in_position_loc);
			GLU_EXPECT_NO_ERROR(gl.getError(), "EnableVertexAttribArray");

			gl.enableVertexAttribArray(in_color_loc);
			GLU_EXPECT_NO_ERROR(gl.getError(), "EnableVertexAttribArray");

			/* Clear */
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ClearColor");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Clear");

			/* Activate program */
			gl.useProgram(po_ids[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

			/* Draw */
			gl.drawArrays(GL_TRIANGLE_STRIP, 0 /* first */, 4 /* count */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

			/* Disable VAO */
			gl.disableVertexAttribArray(in_position_loc);
			GLU_EXPECT_NO_ERROR(gl.getError(), "DisableVertexAttribArray");

			gl.disableVertexAttribArray(in_color_loc);
			GLU_EXPECT_NO_ERROR(gl.getError(), "DisableVertexAttribArray");
		}

		/* Verify results */
		{
			/* Storage for images */
			std::vector<glw::GLuint> fbo_data;
			std::vector<glw::GLuint> noperspective_data;

			fbo_data.resize(image_length);
			noperspective_data.resize(image_length);

			/* Get noperspective image */
			gl.bindTexture(GL_TEXTURE_2D, tex_ids[noperspective_idx]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

			gl.getTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_UNSIGNED_BYTE, &noperspective_data[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexImage");

			/* Compare noperspective with the rest */
			for (size_t i = 0; i < n_shaders; ++i)
			{
				/* Skip noperspective */
				if (noperspective_idx == i)
				{
					continue;
				}

				gl.bindTexture(GL_TEXTURE_2D, tex_ids[i]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

				gl.getTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_UNSIGNED_BYTE, &fbo_data[0]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexImage");

				bool are_same = true;

				for (size_t pixel = 0; pixel < image_length; ++pixel)
				{
					const glw::GLuint left  = noperspective_data[pixel];
					const glw::GLuint right = fbo_data[pixel];

					if (left != right)
					{
						are_same = false;
						break;
					}
				}

				if (true == are_same)
				{
					test_result = false;
					break;
				}
			}
		}

		gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		gl.bindTexture(GL_TEXTURE_2D, 0);
		gl.bindVertexArray(0);
		gl.useProgram(0);

		gl.deleteBuffers(1, &vab_id);
		vab_id = 0;

		gl.deleteVertexArrays(1, &vao_id);
		vao_id = 0;

		gl.deleteFramebuffers(n_shaders, fbo_ids);
		gl.deleteTextures(n_shaders, tex_ids);

		for (size_t idx = 0; idx < n_shaders; ++idx)
		{
			fbo_ids[idx] = 0;
			tex_ids[idx] = 0;
		}

		for (size_t i = 0; i < n_shaders; ++i)
		{
			if (0 != po_ids[i])
			{
				gl.deleteProgram(po_ids[i]);
				po_ids[i] = 0;
			}
		}
	}
	catch (...)
	{
		/* Unbind */
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);

		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

		gl.bindTexture(GL_TEXTURE_2D, 0);

		gl.bindVertexArray(0);

		gl.useProgram(0);

		/* Delete */
		if (0 != vao_id)
		{
			gl.deleteVertexArrays(1, &vao_id);
		}

		if (0 != vab_id)
		{
			gl.deleteBuffers(1, &vab_id);
		}

		if (0 != fbo_ids[0])
		{
			gl.deleteFramebuffers(n_shaders, fbo_ids);
		}

		for (size_t i = 0; i < n_shaders; ++i)
		{
			if (0 != po_ids[i])
			{
				gl.deleteProgram(po_ids[i]);
			}
		}

		if (0 != tex_ids[0])
		{
			gl.deleteTextures(n_shaders, tex_ids);
		}

		/* Clean any error */
		gl.getError();

		/* Rethrow */
		throw;
	}

	/* Set test result */
	if (true == test_result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Clean */
	{
		/* Unbind */
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);

		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

		gl.bindTexture(GL_TEXTURE_2D, 0);

		gl.bindVertexArray(0);

		gl.useProgram(0);

		/* Delete */
		if (0 != vao_id)
		{
			gl.deleteVertexArrays(1, &vao_id);
		}

		if (0 != vab_id)
		{
			gl.deleteBuffers(1, &vab_id);
		}

		if (0 != fbo_ids[0])
		{
			gl.deleteFramebuffers(1, fbo_ids);
		}

		for (size_t i = 0; i < n_shaders; ++i)
		{
			if (0 != po_ids[i])
			{
				gl.deleteProgram(po_ids[i]);
			}
		}

		if (0 != tex_ids[0])
		{
			gl.deleteTextures(1, tex_ids);
		}
	}

	/* Clean any error */
	gl.getError();

	/* Done */
	return STOP;
}